

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

void __thiscall Js::ByteCodeCache::Initialize(ByteCodeCache *this,ScriptContext *scriptContext)

{
  uint uVar1;
  int *piVar2;
  uchar **ppuVar3;
  byte *buffer;
  ulong uVar4;
  int i;
  int iVar5;
  long lVar6;
  uint i_2;
  byte *local_30;
  byte *ptr;
  
  iVar5 = this->reader->string16Count;
  this->propertyCount = iVar5;
  piVar2 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)&scriptContext->sourceCodeAllocator,
                      (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)iVar5);
  this->propertyIds = piVar2;
  for (lVar6 = 0; uVar4 = (ulong)this->propertyCount, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
    piVar2[lVar6] = -1;
  }
  this->raw = this->reader->raw;
  for (iVar5 = 0; iVar5 < (int)uVar4; iVar5 = iVar5 + 1) {
    PopulateLookupPropertyId(this,scriptContext,iVar5);
    uVar4 = (ulong)(uint)this->propertyCount;
  }
  uVar1 = this->reader->scopeInfoCount;
  this->scopeInfoCount = uVar1;
  if ((ulong)uVar1 != 0) {
    ppuVar3 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char_const*,false>
                        ((Memory *)&scriptContext->sourceCodeAllocator,
                         (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(ulong)uVar1);
    this->scopeInfoRelativeOffsets = ppuVar3;
    buffer = this->reader->scopeInfoRelativeOffsets;
    for (uVar4 = 0; uVar4 < this->scopeInfoCount; uVar4 = uVar4 + 1) {
      local_30 = (byte *)0x0;
      buffer = ByteCodeBufferReader::ReadOffsetAsPointer(this->reader,buffer,&local_30);
      this->scopeInfoRelativeOffsets[uVar4] = local_30;
    }
  }
  return;
}

Assistant:

void ByteCodeCache::Initialize(ScriptContext * scriptContext)
{
    auto alloc = scriptContext->SourceCodeAllocator();
    propertyCount = reader->string16Count;
    propertyIds = AnewArray(alloc, PropertyId, propertyCount);
    for (auto i = 0; i < propertyCount; ++i)
    {
        propertyIds[i] = -1;
    }

    raw = reader->raw;

    // Read and populate PropertyIds
    for (int i = 0; i < propertyCount; ++i)
    {
        PopulateLookupPropertyId(scriptContext, i);
    }

    scopeInfoCount = reader->scopeInfoCount;
    if (scopeInfoCount > 0)
    {
        scopeInfoRelativeOffsets = AnewArray(alloc, const byte*, scopeInfoCount);

        const byte* current = reader->scopeInfoRelativeOffsets;
        for (uint i = 0; i < scopeInfoCount; i++)
        {
            const byte* ptr = nullptr;
            current = reader->ReadOffsetAsPointer(current, &ptr);

            scopeInfoRelativeOffsets[i] = ptr;
        }
    }
}